

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

LogicalType * MinMaxType::GetDefault(void)

{
  LogicalType *in_RDI;
  LogicalType *type;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::LogicalType::LogicalType(in_RDI,INTEGER);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"MINMAX",&local_31);
  duckdb::LogicalType::SetAlias(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

static LogicalType GetDefault() {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("MINMAX");
		return type;
	}